

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

string * __thiscall
flatbuffers::python::PythonGenerator::GenMethod_abi_cxx11_
          (string *__return_storage_ptr__,PythonGenerator *this,FieldDef *field)

{
  bool bVar1;
  bool bVar2;
  char *__s;
  allocator<char> local_55 [20];
  byte local_41;
  string local_40;
  FieldDef *local_20;
  FieldDef *field_local;
  PythonGenerator *this_local;
  
  local_20 = field;
  field_local = (FieldDef *)this;
  this_local = (PythonGenerator *)__return_storage_ptr__;
  bVar1 = IsScalar((field->value).type.base_type);
  local_41 = 0;
  bVar2 = false;
  if ((bVar1) || (bVar1 = IsArray(&(local_20->value).type), bVar1)) {
    GenTypeBasic_abi_cxx11_(&local_40,this,&(local_20->value).type);
    local_41 = 1;
    Namer::Method(__return_storage_ptr__,&(this->namer_).super_Namer,&local_40);
  }
  else {
    bVar2 = IsStruct(&(local_20->value).type);
    __s = "UOffsetTRelative";
    if (bVar2) {
      __s = "Struct";
    }
    std::allocator<char>::allocator();
    bVar2 = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,local_55);
  }
  if (bVar2) {
    std::allocator<char>::~allocator(local_55);
  }
  if ((local_41 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenMethod(const FieldDef &field) const {
    return (IsScalar(field.value.type.base_type) || IsArray(field.value.type))
               ? namer_.Method(GenTypeBasic(field.value.type))
               : (IsStruct(field.value.type) ? "Struct" : "UOffsetTRelative");
  }